

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TestHarness::AddType(TestHarness *this,int type,int weight,char *name)

{
  undefined1 local_48 [8];
  Type t;
  char *name_local;
  int weight_local;
  int type_local;
  TestHarness *this_local;
  
  t._32_8_ = name;
  Type::Type((Type *)local_48);
  std::__cxx11::string::operator=((string *)local_48,(char *)t._32_8_);
  t.name.field_2._8_4_ = type;
  t.name.field_2._12_4_ = weight;
  std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::push_back
            (&this->types_,(value_type *)local_48);
  this->total_weight_ = weight + this->total_weight_;
  Type::~Type((Type *)local_48);
  return;
}

Assistant:

void TestHarness::AddType(int type, int weight, const char* name) {
  Type t;
  t.name = name;
  t.type = type;
  t.weight = weight;
  types_.push_back(t);
  total_weight_ += weight;
}